

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
          *handler)

{
  internal *piVar1;
  void *pvVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar3;
  internal *piVar4;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  *this_00;
  char *message;
  char *begin;
  size_t sVar5;
  internal *end;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
             *)format_str.size_;
  if (format_str.data_ == (char *)0x0) {
    return;
  }
  end = (internal *)(format_str.data_ + (long)this);
  do {
    piVar1 = this;
    if (*this != (internal)0x7b) {
      sVar5 = (long)end - (long)this;
      piVar1 = (internal *)memchr(this,0x7b,sVar5);
      if (piVar1 == (internal *)0x0) {
        pvVar2 = memchr(this,0x7d,sVar5);
        if (pvVar2 == (void *)0x0) {
          bVar3.container =
               (this_00->context).
               super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
               .out_.container;
        }
        else {
          do {
            piVar1 = (internal *)((long)pvVar2 + 1);
            if ((piVar1 == end) || (*piVar1 != (internal)0x7d)) {
              message = "unmatched \'}\' in format string";
LAB_001d32cd:
              error_handler::on_error((error_handler *)this_00,message);
              return;
            }
            bVar3.container =
                 (this_00->context).
                 super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
                 .out_.container;
            if (piVar1 != this) {
              bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                      __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                                ((char *)this,(char *)piVar1,bVar3);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
            .out_.container = bVar3.container;
            this = (internal *)((long)pvVar2 + 2);
            sVar5 = (long)end - (long)this;
            pvVar2 = memchr(this,0x7d,sVar5);
          } while (pvVar2 != (void *)0x0);
        }
        if (this != end) {
          bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                            ((char *)this,(char *)(this + sVar5),bVar3);
        }
        (this_00->context).
        super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
        .out_.container = bVar3.container;
        return;
      }
    }
    if (this != piVar1) {
      sVar5 = (long)piVar1 - (long)this;
      pvVar2 = memchr(this,0x7d,sVar5);
      if (pvVar2 == (void *)0x0) {
        bVar3.container =
             (this_00->context).
             super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
             .out_.container;
      }
      else {
        do {
          piVar4 = (internal *)((long)pvVar2 + 1);
          if ((piVar4 == piVar1) || (*piVar4 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001d315d;
          }
          bVar3.container =
               (this_00->context).
               super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
               .out_.container;
          if (piVar4 != this) {
            bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                              ((char *)this,(char *)piVar4,bVar3);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
          .out_.container = bVar3.container;
          this = (internal *)((long)pvVar2 + 2);
          sVar5 = (long)piVar1 - (long)this;
          pvVar2 = memchr(this,0x7d,sVar5);
        } while (pvVar2 != (void *)0x0);
      }
      if (this != piVar1) {
        bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                          ((char *)this,(char *)(this + sVar5),bVar3);
      }
      (this_00->context).
      super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
      .out_.container = bVar3.container;
    }
LAB_001d315d:
    piVar4 = piVar1 + 1;
    if (piVar4 == end) {
      message = "invalid format string";
      goto LAB_001d32cd;
    }
    if (*piVar4 == (internal)0x7b) {
      bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                        ((char *)piVar4,(char *)(piVar1 + 2),
                         (this_00->context).
                         super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
                         .out_.container);
      (this_00->context).
      super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
      .out_.container = bVar3.container;
    }
    else {
      if (*piVar4 != (internal)0x7d) {
        local_58._0_8_ = this_00;
        piVar4 = (internal *)
                 parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>&,char>>
                           ((char *)piVar4,(char *)end,
                            (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_&,_char>
                             *)&local_58.string);
        if (piVar4 != end) {
          if (*piVar4 == (internal)0x3a) {
            piVar4 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                     ::on_format_specs(this_00,(char *)(piVar4 + 1),(char *)end);
            if ((piVar4 != end) && (*piVar4 == (internal)0x7d)) goto LAB_001d321b;
            message = "unknown format specifier";
            goto LAB_001d32cd;
          }
          if (*piVar4 == (internal)0x7d) goto LAB_001d31e8;
        }
        message = "missing \'}\' in format string";
        goto LAB_001d32cd;
      }
      basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>
      ::next_arg((format_arg *)&local_58.string,&this_00->context);
      (this_00->arg).type_ = local_48;
      (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
      (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001d31e8:
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
      ::on_replacement_field(this_00,(char *)piVar4);
    }
LAB_001d321b:
    this = piVar4 + 1;
    if (this == end) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}